

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

int __thiscall soplex::SVectorBase<double>::pos(SVectorBase<double> *this,int i)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this->m_elem != (Nonzero<double> *)0x0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)this->memused;
    if (this->memused < 1) {
      uVar3 = uVar2;
    }
    piVar1 = &this->m_elem->idx;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      if (*piVar1 == i) {
        return (int)uVar2;
      }
      piVar1 = piVar1 + 4;
    }
  }
  return -1;
}

Assistant:

int pos(int i) const
   {
      if(m_elem != nullptr)
      {
         int n = size();

         for(int p = 0; p < n; ++p)
         {
            if(m_elem[p].idx == i)
            {
               assert(index(p) == i);
               return p;
            }
         }
      }

      return -1;
   }